

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O1

HRESULT RunBgParseSync(LPCSTR fileContents,UINT lengthBytes,char *fileName)

{
  DWORD DVar1;
  JsErrorCode JVar2;
  size_t sVar3;
  DWORD_PTR DVar4;
  PAL_FILE *pPVar5;
  LPCWSTR pWVar6;
  size_t sVar7;
  JsValueRef *extraout_RDX;
  JsFinalizeCallback p_Var8;
  char16_t *format;
  JsScriptContents *__s;
  JsValueRef pvStackY_2d0;
  ulong uStackY_2c8;
  short *psStackY_2c0;
  JsAPIHooks *pJStackY_2b8;
  LPCSTR pCStackY_2b0;
  char *pcStackY_2a8;
  code *pcStackY_2a0;
  short local_288 [4];
  WCHAR fileNameWide [260];
  undefined1 auStack_78 [8];
  JsScriptContents scriptContents;
  JsValueRef local_48;
  JsValueRef bgResult;
  JsValueRef scriptSource;
  DWORD cookie;
  
  pcStackY_2a0 = (code *)0x108c11;
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateExternalArrayBuffer)
            (fileContents,lengthBytes,(JsFinalizeCallback)0x0,fileContents,&bgResult);
  pcStackY_2a0 = (code *)0x108c27;
  memset(local_288,0,0x208);
  pcStackY_2a0 = (code *)0x108c2f;
  sVar3 = strlen(fileName);
  if (sVar3 != 0) {
    sVar7 = 0;
    do {
      local_288[sVar7] = (short)fileName[sVar7];
      sVar7 = sVar7 + 1;
    } while (sVar3 != sVar7);
  }
  __s = (JsScriptContents *)auStack_78;
  scriptContents.encodingType = Utf8;
  scriptContents.containerType = HeapAllocatedBuffer;
  scriptContents.container = (void *)0x0;
  p_Var8 = (JsFinalizeCallback)((long)&scriptSource + 4);
  scriptSource._4_4_ = 0;
  pcStackY_2a0 = (code *)0x108c7f;
  auStack_78 = (undefined1  [8])fileContents;
  scriptContents.sourceContext = (ulong)lengthBytes;
  scriptContents.contentLengthInBytes = (size_t)local_288;
  JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtQueueBackgroundParse_Experimental)
                    (__s,(DWORD *)p_Var8);
  DVar1 = scriptSource._4_4_;
  if (JVar2 != JsNoError) {
    pcStackY_2a0 = GetParserStateBuffer;
    RunBgParseSync();
    pJStackY_2b8 = &ChakraRTInterface::m_jsApiHooks;
    pvStackY_2d0 = (JsValueRef)0x0;
    uStackY_2c8 = (ulong)lengthBytes;
    psStackY_2c0 = local_288;
    pCStackY_2b0 = fileContents;
    pcStackY_2a8 = fileName;
    pcStackY_2a0 = (code *)&stack0xfffffffffffffff8;
    sVar3 = strlen((char *)__s);
    JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateExternalArrayBuffer)
                      (__s,(uint)sVar3,p_Var8,__s,&pvStackY_2d0);
    if (JVar2 == JsNoError) {
      JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSerializeParserState)
                        (pvStackY_2d0,extraout_RDX,JsParseScriptAttributeNone);
      if (JVar2 == JsNoError) {
        return 0;
      }
      pPVar5 = PAL_get_stderr(0);
      pWVar6 = Helpers::JsErrorCodeToString(JVar2);
      format = 
      L"ERROR: ChakraRTInterface::JsSerializeParserState(scriptSource, parserStateBuffer, JsParseScriptAttributeNone) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
    else {
      pPVar5 = PAL_get_stderr(0);
      pWVar6 = Helpers::JsErrorCodeToString(JVar2);
      format = 
      L"ERROR: ChakraRTInterface::JsCreateExternalArrayBuffer((void*)fileContents, (unsigned int)strlen(fileContents), fileContentsFinalizeCallback, (void*)fileContents, &scriptSource) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
    PAL_fwprintf(pPVar5,format,(ulong)JVar2,pWVar6);
    pPVar5 = PAL_get_stderr(0);
    PAL_fflush(pPVar5);
    return 0;
  }
  local_48 = (JsValueRef)0x0;
  pcStackY_2a0 = (code *)0x108c9a;
  DVar4 = WScriptJsrt::GetNextSourceContext();
  pcStackY_2a0 = (code *)0x108cb7;
  JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtExecuteBackgroundParse_Experimental)
                    (DVar1,bgResult,DVar4,(WCHAR *)scriptContents.contentLengthInBytes,
                     JsParseScriptAttributeNone,(JsValueRef)0x0,&local_48);
  return JVar2;
}

Assistant:

HRESULT RunBgParseSync(LPCSTR fileContents, UINT lengthBytes, const char* fileName)
{
    JsValueRef scriptSource;
    JsErrorCode e = (ChakraRTInterface::JsCreateExternalArrayBuffer((void*)fileContents,
        (unsigned int)lengthBytes,
        nullptr, (void*)fileContents, &scriptSource));

    // What's the preferred way of doing this?
    WCHAR fileNameWide[MAX_PATH] = { 0 };
    size_t fileNameLength = strlen(fileName);
    for (size_t i = 0; i < fileNameLength; i++)
    {
        fileNameWide[i] = fileName[i];
    }

    JsScriptContents scriptContents = { 0 };
    scriptContents.container = (LPVOID)fileContents;
    scriptContents.containerType = JsScriptContainerType::HeapAllocatedBuffer;
    scriptContents.encodingType = JsScriptEncodingType::Utf8;
    scriptContents.contentLengthInBytes = lengthBytes;
    scriptContents.fullPath = fileNameWide;

    DWORD cookie = 0;
    e = ChakraRTInterface::JsQueueBackgroundParse_Experimental(&scriptContents, &cookie);
    Assert(e == JsErrorCode::JsNoError);

    JsValueRef bgResult = nullptr;
    e = ChakraRTInterface::JsExecuteBackgroundParse_Experimental(
        cookie,
        scriptSource,
        WScriptJsrt::GetNextSourceContext(),
        (WCHAR*)scriptContents.fullPath,
        JsParseScriptAttributes::JsParseScriptAttributeNone,
        nullptr,//_In_ JsValueRef parserState,
        &bgResult
    );

    return e;
}